

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GTestPluginManager.cpp
# Opt level: O2

void __thiscall
TestPluginManager_requestUnlistedPlugin_Test::TestBody
          (TestPluginManager_requestUnlistedPlugin_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_c0;
  AssertionResult gtest_ar;
  undefined8 local_a8;
  undefined8 uStack_a0;
  shared_ptr<plugin::interfaces::IGeneratorManager> local_98 [2];
  helpers local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  string local_68;
  PluginManager pm;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"pluginlist_onlyone.pb.txt",(allocator<char> *)&gtest_ar);
  plugin::PluginManager::PluginManager(&pm,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  gtest_ar._0_8_ = &local_a8;
  local_a8 = 0;
  uStack_a0 = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    plugin::helpers::
    GetSinglePlugin<plugin::interfaces::IGeneratorManager,plugin::interfaces::IGeneratorManager>
              (local_78,&pm);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  }
  std::__cxx11::string::assign(&gtest_ar.success_);
  testing::Message::Message((Message *)local_98);
  testing::internal::AssertHelper::AssertHelper
            (&local_c0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
             ,0x73,(char *)gtest_ar._0_8_);
  testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_98);
  testing::internal::AssertHelper::~AssertHelper(&local_c0);
  if (local_98[0].
      super___shared_ptr<plugin::interfaces::IGeneratorManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    (**(code **)(*(long *)local_98[0].
                          super___shared_ptr<plugin::interfaces::IGeneratorManager,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 8))();
  }
  std::__cxx11::string::~string((string *)&gtest_ar);
  local_c0.data_ = (AssertHelperData *)0x0;
  plugin::helpers::
  GetOptionalPlugin<plugin::interfaces::IGeneratorManager,plugin::interfaces::IGeneratorManager>
            ((helpers *)local_98,&pm);
  testing::internal::
  CmpHelperEQ<decltype(nullptr),std::shared_ptr<plugin::interfaces::IGeneratorManager>>
            ((internal *)&gtest_ar,"nullptr",
             "plugin::helpers::GetOptionalPlugin<plugin::interfaces::IGeneratorManager>(pm)",
             &local_c0.data_,local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98[0].
              super___shared_ptr<plugin::interfaces::IGeneratorManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_98);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
               ,0x76,message);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_98[0].
        super___shared_ptr<plugin::interfaces::IGeneratorManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      (**(code **)(*(long *)local_98[0].
                            super___shared_ptr<plugin::interfaces::IGeneratorManager,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  plugin::PluginManager::~PluginManager(&pm);
  return;
}

Assistant:

TEST(TestPluginManager, requestUnlistedPlugin)
{
    plugin::PluginManager pm("pluginlist_onlyone.pb.txt");

    // Get plugin that doesn't exist, ensure exception thrown
    EXPECT_THROW(plugin::helpers::GetSinglePlugin<plugin::interfaces::IGeneratorManager>(pm), plugin::exceptions::PluginError);

    // Get plugin that doesn't exist, ensure no exception thrown
    EXPECT_EQ(nullptr, plugin::helpers::GetOptionalPlugin<plugin::interfaces::IGeneratorManager>(pm));
}